

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O3

Int __thiscall ipx::Maxvolume::RunSequential(Maxvolume *this,double *colscale,Basis *basis)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  double *pdVar5;
  bool bVar6;
  Int IVar7;
  int iVar8;
  Model *pMVar9;
  void *__s;
  Int m;
  long lVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  bool exchanged;
  Timer timer;
  IndexedVector ftran;
  bool local_bd;
  int local_bc;
  double local_b8;
  Int local_b0;
  ipxint local_ac;
  vector<int,_std::allocator<int>_> local_a8;
  double *local_90;
  long local_88;
  double local_80;
  double *local_78;
  double local_70;
  Timer local_68;
  IndexedVector local_60;
  
  pMVar9 = Basis::model(basis);
  IVar7 = pMVar9->num_rows_;
  local_b0 = pMVar9->num_cols_;
  IndexedVector::IndexedVector(&local_60,IVar7);
  Timer::Timer(&local_68);
  local_ac = (this->control_->parameters_).super_ipx_parameters.maxpasses;
  dVar13 = (this->control_->parameters_).super_ipx_parameters.volume_tol;
  local_70 = 1.0;
  if (1.0 <= dVar13) {
    local_70 = dVar13;
  }
  local_b8 = (double)CONCAT44(local_b8._4_4_,IVar7);
  uVar12 = (long)IVar7 * 8;
  __s = operator_new(uVar12);
  memset(__s,0,uVar12);
  if (0 < local_b8._0_4_) {
    piVar3 = (basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = basis->model_->num_rows_;
    piVar4 = (basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      iVar11 = piVar3[lVar10];
      iVar8 = piVar4[iVar11];
      if ((-1 < iVar8) && (iVar8 < iVar1)) {
        dVar13 = 1.0;
        if (colscale != (double *)0x0) {
          dVar13 = 1.0 / colscale[iVar11];
        }
        *(double *)((long)__s + lVar10 * 8) = dVar13;
      }
      lVar10 = lVar10 + 1;
    } while (IVar7 != lVar10);
  }
  local_90 = &this->tblmax_;
  this->volinc_ = 0.0;
  this->time_ = 0.0;
  this->updates_ = 0;
  this->skipped_ = 0;
  this->passes_ = 0;
  this->slices_ = 0;
  this->tblnnz_ = 0;
  this->tblmax_ = 0.0;
  this->frobnorm_squared_ = 0.0;
  local_b0 = local_b0 + local_b8._0_4_;
  local_78 = colscale;
  do {
    pdVar5 = local_78;
    if ((-1 < local_ac) && (local_ac <= this->passes_)) {
      IVar7 = 0;
      break;
    }
    this->tblnnz_ = 0;
    *local_90 = 0.0;
    local_90[1] = 0.0;
    Sortperm(&local_a8,local_b0,local_78,false);
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      local_bc = 0;
LAB_003a534e:
      IVar7 = 0;
    }
    else {
      local_bc = 0;
      do {
        while( true ) {
          iVar1 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
          dVar13 = 1.0;
          if (pdVar5 != (double *)0x0) {
            dVar13 = pdVar5[iVar1];
            if ((dVar13 == 0.0) && (!NAN(dVar13))) goto LAB_003a534e;
          }
          if ((basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar1] == -1) break;
LAB_003a529e:
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
          if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start ==
              local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish) goto LAB_003a534e;
        }
        local_b8 = dVar13;
        IVar7 = Control::InterruptCheck(this->control_,-1);
        if (IVar7 != 0) break;
        Basis::SolveForUpdate(basis,iVar1,&local_60);
        bVar6 = IndexedVector::sparse(&local_60);
        if (bVar6) {
          if ((long)local_60.nnz_ < 1) {
LAB_003a526f:
            iVar8 = -1;
            dVar14 = 0.0;
          }
          else {
            iVar11 = this->tblnnz_;
            dVar13 = this->frobnorm_squared_;
            iVar8 = -1;
            dVar14 = 0.0;
            lVar10 = 0;
            do {
              iVar2 = local_60.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar10];
              dVar15 = ABS(local_60.elements_._M_data[iVar2]) *
                       *(double *)((long)__s + (long)iVar2 * 8) * local_b8;
              dVar16 = dVar15;
              if (dVar15 <= dVar14) {
                dVar16 = dVar14;
                iVar2 = iVar8;
              }
              iVar8 = iVar2;
              dVar14 = dVar16;
              iVar11 = iVar11 + (uint)(dVar15 != 0.0);
              this->tblnnz_ = iVar11;
              dVar13 = dVar13 + dVar15 * dVar15;
              this->frobnorm_squared_ = dVar13;
              lVar10 = lVar10 + 1;
            } while (local_60.nnz_ != lVar10);
          }
        }
        else {
          if ((int)(uint)local_60.elements_._M_size < 1) goto LAB_003a526f;
          iVar11 = this->tblnnz_;
          dVar13 = this->frobnorm_squared_;
          iVar8 = -1;
          uVar12 = 0;
          dVar16 = 0.0;
          do {
            dVar15 = ABS(local_60.elements_._M_data[uVar12]) * *(double *)((long)__s + uVar12 * 8) *
                     local_b8;
            dVar14 = dVar15;
            if (dVar15 <= dVar16) {
              dVar14 = dVar16;
            }
            if (dVar16 < dVar15) {
              iVar8 = (int)uVar12;
            }
            iVar11 = iVar11 + (uint)(dVar15 != 0.0);
            dVar13 = dVar13 + dVar15 * dVar15;
            this->frobnorm_squared_ = dVar13;
            uVar12 = uVar12 + 1;
            dVar16 = dVar14;
          } while (((uint)local_60.elements_._M_size & 0x7fffffff) != uVar12);
          this->tblnnz_ = iVar11;
        }
        dVar13 = dVar14;
        if (dVar14 <= *local_90) {
          dVar13 = *local_90;
        }
        *local_90 = dVar13;
        if (dVar14 <= local_70) {
          this->skipped_ = this->skipped_ + 1;
          goto LAB_003a529e;
        }
        local_88 = (long)iVar8;
        local_80 = dVar14;
        IVar7 = Basis::ExchangeIfStable
                          (basis,(basis->basis_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[local_88],iVar1,
                           local_60.elements_._M_data[local_88],-1,&local_bd);
        if (IVar7 != 0) break;
        if (local_bd == true) {
          *(double *)((long)__s + local_88 * 8) = 1.0 / local_b8;
          local_bc = local_bc + 1;
          dVar13 = log2(local_80);
          this->volinc_ = dVar13 + this->volinc_;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
        }
        IVar7 = 0;
      } while (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start !=
               local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    this->updates_ = this->updates_ + local_bc;
    this->passes_ = this->passes_ + 1;
    bVar6 = local_bc != 0;
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  } while (bVar6 && IVar7 == 0);
  dVar13 = Timer::Elapsed(&local_68);
  this->time_ = dVar13;
  operator_delete(__s);
  if (local_60.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(local_60.elements_._M_data);
  return IVar7;
}

Assistant:

Int Maxvolume::RunSequential(const double* colscale, Basis& basis) {
    const Model& model = basis.model();
    const Int m = model.rows();
    const Int n = model.cols();
    IndexedVector ftran(m);
    Timer timer;
    Int errflag = 0;

    const Int maxpasses = control_.maxpasses();
    const double volumetol = std::max(control_.volume_tol(), 1.0);

    // Maintain a copy of the inverse scaling factors of basic variables.
    // If a variable has status BASIC_FREE, its inverse scaling factor is
    // assumed zero, regardless of the entry in colscale. This ensures that
    // BASIC_FREE variables are never pivoted out of the basis.
    Vector invscale_basic(m);
    for (Int p = 0; p < m; p++) {
        Int j = basis[p];
        if (basis.StatusOf(j) == Basis::BASIC)
            invscale_basic[p] = colscale ? 1.0/colscale[j] : 1.0;
    }

    Reset();
    while (passes_ < maxpasses || maxpasses < 0) {
        tblnnz_ = 0;
        tblmax_ = 0.0;
        frobnorm_squared_ = 0.0;
        Int updates_last = 0;   // # basis updates in this pass
        std::vector<Int> candidates = Sortperm(n+m, colscale, false);
        while(!candidates.empty()) {
            Int j = candidates.back();
            const double dj = colscale ? colscale[j] : 1.0;
            if (dj == 0.0)      // all remaining columns have scaling factor 0
                break;
            if (basis.StatusOf(j) != Basis::NONBASIC) {
                candidates.pop_back();
                continue;
            }
            if ((errflag = control_.InterruptCheck()) != 0)
                break;
            basis.SolveForUpdate(j, ftran);
            Int pmax = -1;
            double vmax = 0.0;
            auto search_pivot = [&](Int p, double x) {
                double v = std::abs(x) * invscale_basic[p] * dj;
                if (v > vmax) {
                    vmax = v;
                    pmax = p;
                }
                tblnnz_ += v != 0;
                frobnorm_squared_ += v*v;
            };
            for_each_nonzero(ftran, search_pivot);
            tblmax_ = std::max(tblmax_, vmax);
            if (vmax <= volumetol) {
                skipped_++;
                candidates.pop_back();
                continue;
            }

            const Int jb = basis[pmax];
            assert(basis.StatusOf(jb) == Basis::BASIC);
            bool exchanged;
            errflag = basis.ExchangeIfStable(jb, j, ftran[pmax], -1, &exchanged);
            if (errflag)
                break;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            invscale_basic[pmax] = 1.0 / dj;
            updates_last++;
            volinc_ += std::log2(vmax);
            candidates.pop_back();
        }
        updates_ += updates_last;
        passes_++;
        if (updates_last == 0 || errflag != 0)
            break;
    }
    time_ = timer.Elapsed();
    return errflag;
}